

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock.c
# Opt level: O0

int doclose(int dx,int dy,int dz)

{
  char *pcVar1;
  level *plVar2;
  boolean bVar3;
  schar sVar4;
  schar sVar5;
  schar sVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  monst *local_40;
  schar local_33;
  coord local_32;
  schar unused;
  monst *pmStack_30;
  coord cc;
  monst *mtmp;
  rm *door;
  int iStack_14;
  boolean got_dir;
  int dz_local;
  int dy_local;
  int dx_local;
  
  bVar10 = false;
  if (((youmonst.data)->mflags1 & 0x2000) != 0) {
    pline("You can\'t close anything -- you have no hands!");
    return 0;
  }
  if ((u.utrap != 0) && (u.utraptype == 1)) {
    pline("You can\'t reach over the edge of the pit.");
    return 0;
  }
  if (((dx != -2) && (dy != -2)) && (dz != -2)) {
    local_32.x = u.ux + (char)dx;
    local_32.y = u.uy + (char)dy;
    if ((('\0' < local_32.x) && (local_32.x < 'P')) && ((-1 < local_32.y && (local_32.y < '\x15'))))
    {
      bVar10 = true;
    }
  }
  if ((!bVar10) &&
     (iVar7 = get_adjacent_loc((char *)0x0,(char *)0x0,u.ux,u.uy,&local_32,&local_33), iVar7 == 0))
  {
    return 0;
  }
  plVar2 = level;
  iStack_14 = dy;
  dz_local = dx;
  if (!bVar10) {
    dz_local = (int)local_32.x - (int)u.ux;
    iStack_14 = (int)local_32.y - (int)u.uy;
  }
  if ((local_32.x == u.ux) && (local_32.y == u.uy)) {
    pline("You are in the way!");
    return 1;
  }
  if ((level->monsters[local_32.x][local_32.y] == (monst *)0x0) ||
     ((*(uint *)&level->monsters[local_32.x][local_32.y]->field_0x60 >> 9 & 1) != 0)) {
    local_40 = (monst *)0x0;
  }
  else {
    local_40 = level->monsters[local_32.x][local_32.y];
  }
  pmStack_30 = local_40;
  if ((((local_40 != (monst *)0x0) && (local_40->m_ap_type == '\x01')) &&
      ((local_40->mappearance == 0x1c || (local_40->mappearance == 0x1b)))) &&
     ((u.uprops[0x17].intrinsic == 0 && (u.uprops[0x17].extrinsic == 0)))) {
    stumble_onto_mimic(local_40,(schar)dz_local,(schar)iStack_14);
    return 1;
  }
  lVar8 = (long)local_32.x;
  lVar9 = (long)local_32.y;
  if (level->locations[lVar8][lVar9].typ != '\x17') {
    if (level->locations[lVar8][lVar9].typ == '$') {
      pline("There is no obvious way to close the drawbridge.");
    }
    else {
      if ((u.uprops[0x1e].intrinsic != 0) ||
         (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
          (bVar10 = false, ((youmonst.data)->mflags1 & 0x1000) != 0)))) {
        bVar10 = false;
        if (ublindf != (obj *)0x0) {
          bVar10 = ublindf->oartifact == '\x1d';
        }
        bVar10 = (bool)(bVar10 ^ 1);
      }
      pcVar1 = "not see";
      if (bVar10) {
        pcVar1 = "You feel";
      }
      pline("You %s no door there.",pcVar1 + 4);
    }
    return 0;
  }
  if ((*(uint *)&level->locations[lVar8][lVar9].field_0x6 >> 4 & 0x1f) == 0) {
    pline("This doorway has no door.");
    return 0;
  }
  bVar3 = obstructed((int)local_32.x,(int)local_32.y);
  if (bVar3 != '\0') {
    return 0;
  }
  if ((*(uint *)&plVar2->locations[lVar8][lVar9].field_0x6 >> 4 & 0x1f) != 1) {
    if ((*(uint *)&plVar2->locations[lVar8][lVar9].field_0x6 >> 4 & 0xc) != 0) {
      pline("This door is already closed.");
      return 0;
    }
    if ((*(uint *)&plVar2->locations[lVar8][lVar9].field_0x6 >> 4 & 0x1f) == 2) {
      if (((youmonst.data)->msize == '\0') && (u.usteed == (monst *)0x0)) {
        pline("You\'re too small to push the door closed.");
        return 0;
      }
      if (u.usteed == (monst *)0x0) {
        iVar7 = rn2(0x19);
        sVar4 = acurrstr();
        sVar5 = acurr(3);
        sVar6 = acurr(4);
        if (((int)sVar4 + (int)sVar5 + (int)sVar6) / 3 <= iVar7) {
          exercise(0,'\x01');
          pline("The door resists!");
          return 1;
        }
      }
      pline("The door closes.");
      *(uint *)&plVar2->locations[lVar8][lVar9].field_0x6 =
           *(uint *)&plVar2->locations[lVar8][lVar9].field_0x6 & 0xfffffe0f | 0x40;
      *(uint *)&plVar2->locations[lVar8][lVar9].field_0x6 =
           *(uint *)&plVar2->locations[lVar8][lVar9].field_0x6 & 0xfffffffe | 1;
      map_background(local_32.x,local_32.y,1);
      if ((((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed))))
          && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
        newsym((int)local_32.x,(int)local_32.y);
      }
      else {
        feel_location(local_32.x,local_32.y);
      }
      block_point((int)local_32.x,(int)local_32.y);
    }
    return 1;
  }
  pline("This door is broken.");
  return 0;
}

Assistant:

int doclose(int dx, int dy, int dz)
{
        boolean got_dir = FALSE;
	struct rm *door;
	struct monst *mtmp;
        coord cc;
        schar unused;

	if (nohands(youmonst.data)) {
	    pline("You can't close anything -- you have no hands!");
	    return 0;
	}

	if (u.utrap && u.utraptype == TT_PIT) {
	    pline("You can't reach over the edge of the pit.");
	    return 0;
	}

	if (dx != -2 && dy != -2 && dz != -2) { /* -2 signals no direction given  */
	    cc.x = u.ux + dx;
	    cc.y = u.uy + dy;
	    if (isok(cc.x, cc.y))
		got_dir = TRUE;
	}

	if (!got_dir && !get_adjacent_loc(NULL, NULL, u.ux, u.uy, &cc, &unused))
	    return 0;

        if (!got_dir) {
          dx = cc.x-u.ux;
          dy = cc.y-u.uy;
          dz = 0;
        }

	if ((cc.x == u.ux) && (cc.y == u.uy)) {
		pline("You are in the way!");
		return 1;
	}

	if ((mtmp = m_at(level, cc.x, cc.y))		&&
		mtmp->m_ap_type == M_AP_FURNITURE	&&
		(mtmp->mappearance == S_hcdoor ||
			mtmp->mappearance == S_vcdoor)	&&
		!Protection_from_shape_changers)	 {

	    stumble_onto_mimic(mtmp, dx, dy);
	    return 1;
	}

	door = &level->locations[cc.x][cc.y];

	if (!IS_DOOR(door->typ)) {
		if (door->typ == DRAWBRIDGE_DOWN)
		    pline("There is no obvious way to close the drawbridge.");
		else
		    pline("You %s no door there.",
				Blind ? "feel" : "see");
		return 0;
	}

	if (door->doormask == D_NODOOR) {
	    pline("This doorway has no door.");
	    return 0;
	}

	if (obstructed(cc.x, cc.y)) return 0;

	if (door->doormask == D_BROKEN) {
	    pline("This door is broken.");
	    return 0;
	}

	if (door->doormask & (D_CLOSED | D_LOCKED)) {
	    pline("This door is already closed.");
	    return 0;
	}

	if (door->doormask == D_ISOPEN) {
	    if (verysmall(youmonst.data) && !u.usteed) {
		 pline("You're too small to push the door closed.");
		 return 0;
	    }
	    if (u.usteed ||
		rn2(25) < (ACURRSTR+ACURR(A_DEX)+ACURR(A_CON))/3) {
		pline("The door closes.");
		door->doormask = D_CLOSED;
		door->mem_door_l = 1;
		/*
		 * map_background() here sets the mem_door flags correctly;
		 * and it's redundant to both feel_location() and newsym()
		 * with a door.
		 *
		 * Exception: if we remember an invisible monster on the
		 * door square, but in this case, we want to set the
		 * memory of a door there anyway because we know there's a
		 * door there because we just closed it, and with layered
		 * memory this doesn't clash with keeping the I there.
		 */
		map_background(cc.x, cc.y, TRUE);
		if (Blind)
		    feel_location(cc.x,cc.y);	/* the hero knows she closed it */
		else
		    newsym(cc.x,cc.y);
		block_point(cc.x,cc.y);	/* vision:  no longer see there */
	    }
	    else {
	        exercise(A_STR, TRUE);
	        pline("The door resists!");
	    }
	}

	return 1;
}